

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  uint uVar20;
  undefined1 (*pauVar21) [16];
  long lVar22;
  long lVar23;
  byte bVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [16];
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  float fVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar62 [64];
  undefined1 auVar66 [32];
  uint uVar68;
  uint uVar69;
  undefined1 auVar67 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined4 uVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2870 [16];
  long local_2860;
  long local_2858;
  ulong local_2850;
  Scene *local_2848;
  undefined1 (*local_2840) [16];
  ulong local_2838;
  RTCFilterFunctionNArguments local_2830;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  RTCHitN local_2790 [16];
  undefined1 local_2780 [16];
  undefined1 local_2770 [16];
  undefined1 local_2760 [16];
  undefined4 local_2750;
  undefined4 uStack_274c;
  undefined4 uStack_2748;
  undefined4 uStack_2744;
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  uint local_2720;
  uint uStack_271c;
  uint uStack_2718;
  uint uStack_2714;
  uint uStack_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar21 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar85 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2400._4_4_ = fVar2;
  local_2400._0_4_ = fVar2;
  local_2400._8_4_ = fVar2;
  local_2400._12_4_ = fVar2;
  local_2400._16_4_ = fVar2;
  local_2400._20_4_ = fVar2;
  local_2400._24_4_ = fVar2;
  local_2400._28_4_ = fVar2;
  auVar55 = ZEXT3264(local_2400);
  fVar59 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2420._4_4_ = fVar59;
  local_2420._0_4_ = fVar59;
  local_2420._8_4_ = fVar59;
  local_2420._12_4_ = fVar59;
  local_2420._16_4_ = fVar59;
  local_2420._20_4_ = fVar59;
  local_2420._24_4_ = fVar59;
  local_2420._28_4_ = fVar59;
  auVar58 = ZEXT3264(local_2420);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar59 = fVar59 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2850 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2838 = local_2850 ^ 0x20;
  iVar25 = (tray->tfar).field_0.i[k];
  auVar40 = ZEXT3264(CONCAT428(iVar25,CONCAT424(iVar25,CONCAT420(iVar25,CONCAT416(iVar25,CONCAT412(
                                                  iVar25,CONCAT48(iVar25,CONCAT44(iVar25,iVar25)))))
                                               )));
  local_23e0._8_4_ = 0x80000000;
  local_23e0._0_8_ = 0x8000000080000000;
  local_23e0._12_4_ = 0x80000000;
  local_23e0._16_4_ = 0x80000000;
  local_23e0._20_4_ = 0x80000000;
  local_23e0._24_4_ = 0x80000000;
  local_23e0._28_4_ = 0x80000000;
  local_2440._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar1;
  local_2440._12_4_ = -fVar1;
  local_2440._16_4_ = -fVar1;
  local_2440._20_4_ = -fVar1;
  local_2440._24_4_ = -fVar1;
  local_2440._28_4_ = -fVar1;
  auVar62 = ZEXT3264(local_2440);
  local_2460._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_2460._8_4_ = -fVar2;
  local_2460._12_4_ = -fVar2;
  local_2460._16_4_ = -fVar2;
  local_2460._20_4_ = -fVar2;
  local_2460._24_4_ = -fVar2;
  local_2460._28_4_ = -fVar2;
  auVar67 = ZEXT3264(local_2460);
  local_2480._0_8_ = CONCAT44(fVar59,fVar59) ^ 0x8000000080000000;
  local_2480._8_4_ = -fVar59;
  local_2480._12_4_ = -fVar59;
  local_2480._16_4_ = -fVar59;
  local_2480._20_4_ = -fVar59;
  local_2480._24_4_ = -fVar59;
  local_2480._28_4_ = -fVar59;
  auVar73 = ZEXT3264(local_2480);
  iVar25 = (tray->tnear).field_0.i[k];
  local_24a0._4_4_ = iVar25;
  local_24a0._0_4_ = iVar25;
  local_24a0._8_4_ = iVar25;
  local_24a0._12_4_ = iVar25;
  local_24a0._16_4_ = iVar25;
  local_24a0._20_4_ = iVar25;
  local_24a0._24_4_ = iVar25;
  local_24a0._28_4_ = iVar25;
  auVar76 = ZEXT3264(local_24a0);
  local_24c0._16_16_ = mm_lookupmask_ps._240_16_;
  local_24c0._0_16_ = mm_lookupmask_ps._0_16_;
  local_2840 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar48._8_4_ = 0x3f800000;
  auVar48._0_8_ = 0x3f8000003f800000;
  auVar48._12_4_ = 0x3f800000;
  auVar48._16_4_ = 0x3f800000;
  auVar48._20_4_ = 0x3f800000;
  auVar48._24_4_ = 0x3f800000;
  auVar48._28_4_ = 0x3f800000;
  auVar57._8_4_ = 0xbf800000;
  auVar57._0_8_ = 0xbf800000bf800000;
  auVar57._12_4_ = 0xbf800000;
  auVar57._16_4_ = 0xbf800000;
  auVar57._20_4_ = 0xbf800000;
  auVar57._24_4_ = 0xbf800000;
  auVar57._28_4_ = 0xbf800000;
  local_24e0 = vblendvps_avx(auVar48,auVar57,local_24c0);
LAB_005d51df:
  do {
    pauVar34 = pauVar21 + -1;
    pauVar21 = pauVar21 + -1;
    if (*(float *)(*pauVar34 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar29 = *(ulong *)*pauVar21;
      while ((uVar29 & 8) == 0) {
        auVar60 = auVar62._0_32_;
        auVar41 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + local_2850),auVar60,
                                  auVar85._0_32_);
        auVar52 = auVar55._0_32_;
        auVar66 = auVar67._0_32_;
        auVar45 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + uVar33),auVar66,auVar52);
        auVar57 = vpmaxsd_avx2(ZEXT1632(auVar41),ZEXT1632(auVar45));
        auVar37 = auVar58._0_32_;
        auVar70 = auVar73._0_32_;
        auVar41 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + uVar35),auVar70,auVar37);
        auVar48 = vpmaxsd_avx2(ZEXT1632(auVar41),auVar76._0_32_);
        local_2700 = vpmaxsd_avx2(auVar57,auVar48);
        auVar41 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + local_2838),auVar60,
                                  auVar85._0_32_);
        auVar45 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + (uVar33 ^ 0x20)),auVar66,
                                  auVar52);
        auVar57 = vpminsd_avx2(ZEXT1632(auVar41),ZEXT1632(auVar45));
        auVar41 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + (uVar35 ^ 0x20)),auVar70,
                                  auVar37);
        auVar48 = vpminsd_avx2(ZEXT1632(auVar41),auVar40._0_32_);
        auVar57 = vpminsd_avx2(auVar57,auVar48);
        auVar57 = vpcmpgtd_avx2(local_2700,auVar57);
        iVar25 = vmovmskps_avx(auVar57);
        if (iVar25 == 0xff) {
          if (pauVar21 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005d51df;
        }
        bVar24 = ~(byte)iVar25;
        uVar32 = uVar29 & 0xfffffffffffffff0;
        lVar23 = 0;
        for (uVar29 = (ulong)bVar24; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
          lVar23 = lVar23 + 1;
        }
        uVar29 = *(ulong *)(uVar32 + lVar23 * 8);
        uVar26 = bVar24 - 1 & (uint)bVar24;
        uVar27 = (ulong)uVar26;
        if (uVar26 != 0) {
          uVar20 = *(uint *)(local_2700 + lVar23 * 4);
          lVar23 = 0;
          for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
            lVar23 = lVar23 + 1;
          }
          uVar26 = uVar26 - 1 & uVar26;
          uVar31 = (ulong)uVar26;
          uVar27 = *(ulong *)(uVar32 + lVar23 * 8);
          uVar68 = *(uint *)(local_2700 + lVar23 * 4);
          if (uVar26 == 0) {
            if (uVar20 < uVar68) {
              *(ulong *)*pauVar21 = uVar27;
              *(uint *)(*pauVar21 + 8) = uVar68;
              pauVar21 = pauVar21 + 1;
            }
            else {
              *(ulong *)*pauVar21 = uVar29;
              *(uint *)(*pauVar21 + 8) = uVar20;
              pauVar21 = pauVar21 + 1;
              uVar29 = uVar27;
            }
          }
          else {
            auVar41._8_8_ = 0;
            auVar41._0_8_ = uVar29;
            auVar41 = vpunpcklqdq_avx(auVar41,ZEXT416(uVar20));
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar27;
            auVar45 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar68));
            lVar23 = 0;
            for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              lVar23 = lVar23 + 1;
            }
            uVar26 = uVar26 - 1 & uVar26;
            uVar29 = (ulong)uVar26;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = *(ulong *)(uVar32 + lVar23 * 8);
            auVar42 = vpunpcklqdq_avx(auVar47,ZEXT416(*(uint *)(local_2700 + lVar23 * 4)));
            auVar47 = vpcmpgtd_avx(auVar45,auVar41);
            if (uVar26 == 0) {
              auVar51 = vpshufd_avx(auVar47,0xaa);
              auVar47 = vblendvps_avx(auVar45,auVar41,auVar51);
              auVar41 = vblendvps_avx(auVar41,auVar45,auVar51);
              auVar45 = vpcmpgtd_avx(auVar42,auVar47);
              auVar51 = vpshufd_avx(auVar45,0xaa);
              auVar45 = vblendvps_avx(auVar42,auVar47,auVar51);
              auVar47 = vblendvps_avx(auVar47,auVar42,auVar51);
              auVar42 = vpcmpgtd_avx(auVar47,auVar41);
              auVar51 = vpshufd_avx(auVar42,0xaa);
              auVar42 = vblendvps_avx(auVar47,auVar41,auVar51);
              auVar41 = vblendvps_avx(auVar41,auVar47,auVar51);
              *pauVar21 = auVar41;
              pauVar21[1] = auVar42;
              uVar29 = auVar45._0_8_;
              pauVar21 = pauVar21 + 2;
            }
            else {
              lVar23 = 0;
              for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                lVar23 = lVar23 + 1;
              }
              uVar26 = uVar26 - 1 & uVar26;
              uVar27 = (ulong)uVar26;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = *(ulong *)(uVar32 + lVar23 * 8);
              auVar51 = vpunpcklqdq_avx(auVar51,ZEXT416(*(uint *)(local_2700 + lVar23 * 4)));
              if (uVar26 == 0) {
                auVar36 = vpshufd_avx(auVar47,0xaa);
                auVar47 = vblendvps_avx(auVar45,auVar41,auVar36);
                auVar41 = vblendvps_avx(auVar41,auVar45,auVar36);
                auVar45 = vpcmpgtd_avx(auVar51,auVar42);
                auVar36 = vpshufd_avx(auVar45,0xaa);
                auVar45 = vblendvps_avx(auVar51,auVar42,auVar36);
                auVar42 = vblendvps_avx(auVar42,auVar51,auVar36);
                auVar51 = vpcmpgtd_avx(auVar42,auVar41);
                auVar36 = vpshufd_avx(auVar51,0xaa);
                auVar51 = vblendvps_avx(auVar42,auVar41,auVar36);
                auVar41 = vblendvps_avx(auVar41,auVar42,auVar36);
                auVar42 = vpcmpgtd_avx(auVar45,auVar47);
                auVar36 = vpshufd_avx(auVar42,0xaa);
                auVar42 = vblendvps_avx(auVar45,auVar47,auVar36);
                auVar45 = vblendvps_avx(auVar47,auVar45,auVar36);
                auVar47 = vpcmpgtd_avx(auVar51,auVar45);
                auVar36 = vpshufd_avx(auVar47,0xaa);
                auVar47 = vblendvps_avx(auVar51,auVar45,auVar36);
                auVar45 = vblendvps_avx(auVar45,auVar51,auVar36);
                *pauVar21 = auVar41;
                pauVar21[1] = auVar45;
                pauVar21[2] = auVar47;
                uVar29 = auVar42._0_8_;
                pauVar34 = pauVar21 + 3;
              }
              else {
                *pauVar21 = auVar41;
                pauVar21[1] = auVar45;
                pauVar21[2] = auVar42;
                pauVar21[3] = auVar51;
                lVar23 = 0x30;
                do {
                  lVar22 = lVar23;
                  lVar23 = 0;
                  for (uVar29 = uVar27; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000
                      ) {
                    lVar23 = lVar23 + 1;
                  }
                  uVar29 = *(ulong *)(uVar32 + lVar23 * 8);
                  auVar42._8_8_ = 0;
                  auVar42._0_8_ = uVar29;
                  auVar41 = vpunpcklqdq_avx(auVar42,ZEXT416(*(uint *)(local_2700 + lVar23 * 4)));
                  *(undefined1 (*) [16])(pauVar21[1] + lVar22) = auVar41;
                  uVar27 = uVar27 - 1 & uVar27;
                  lVar23 = lVar22 + 0x10;
                } while (uVar27 != 0);
                pauVar34 = (undefined1 (*) [16])(pauVar21[1] + lVar22);
                if (lVar22 + 0x10 != 0) {
                  lVar23 = 0x10;
                  pauVar28 = pauVar21;
                  do {
                    auVar41 = pauVar28[1];
                    pauVar28 = pauVar28 + 1;
                    uVar26 = vextractps_avx(auVar41,2);
                    lVar22 = lVar23;
                    do {
                      if (uVar26 <= *(uint *)(pauVar21[-1] + lVar22 + 8)) {
                        pauVar30 = (undefined1 (*) [16])(*pauVar21 + lVar22);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar21 + lVar22) =
                           *(undefined1 (*) [16])(pauVar21[-1] + lVar22);
                      lVar22 = lVar22 + -0x10;
                      pauVar30 = pauVar21;
                    } while (lVar22 != 0);
                    *pauVar30 = auVar41;
                    lVar23 = lVar23 + 0x10;
                  } while (pauVar34 != pauVar28);
                  uVar29 = *(ulong *)*pauVar34;
                }
              }
              auVar55 = ZEXT3264(auVar52);
              auVar58 = ZEXT3264(auVar37);
              auVar62 = ZEXT3264(auVar60);
              auVar67 = ZEXT3264(auVar66);
              auVar73 = ZEXT3264(auVar70);
              auVar76 = ZEXT3264(auVar76._0_32_);
              pauVar21 = pauVar34;
            }
          }
        }
      }
      local_2858 = (ulong)((uint)uVar29 & 0xf) - 8;
      if (local_2858 != 0) {
        uVar29 = uVar29 & 0xfffffffffffffff0;
        local_2860 = 0;
        do {
          lVar22 = local_2860 * 0xe0;
          lVar23 = uVar29 + 0xd0 + lVar22;
          local_27c0 = *(undefined8 *)(lVar23 + 0x10);
          uStack_27b8 = *(undefined8 *)(lVar23 + 0x18);
          lVar23 = uVar29 + 0xc0 + lVar22;
          local_23c0 = *(undefined8 *)(lVar23 + 0x10);
          uStack_23b8 = *(undefined8 *)(lVar23 + 0x18);
          uStack_23b0 = local_23c0;
          uStack_23a8 = uStack_23b8;
          uStack_27b0 = local_27c0;
          uStack_27a8 = uStack_27b8;
          auVar49._16_16_ = *(undefined1 (*) [16])(uVar29 + 0x60 + lVar22);
          auVar49._0_16_ = *(undefined1 (*) [16])(uVar29 + lVar22);
          auVar53._16_16_ = *(undefined1 (*) [16])(uVar29 + 0x70 + lVar22);
          auVar53._0_16_ = *(undefined1 (*) [16])(uVar29 + 0x10 + lVar22);
          auVar56._16_16_ = *(undefined1 (*) [16])(uVar29 + 0x80 + lVar22);
          auVar56._0_16_ = *(undefined1 (*) [16])(uVar29 + 0x20 + lVar22);
          auVar41 = *(undefined1 (*) [16])(uVar29 + 0x30 + lVar22);
          auVar37._16_16_ = auVar41;
          auVar37._0_16_ = auVar41;
          auVar45 = *(undefined1 (*) [16])(uVar29 + 0x40 + lVar22);
          auVar43._16_16_ = auVar45;
          auVar43._0_16_ = auVar45;
          auVar47 = *(undefined1 (*) [16])(uVar29 + 0x50 + lVar22);
          auVar46._16_16_ = auVar47;
          auVar46._0_16_ = auVar47;
          auVar47 = *(undefined1 (*) [16])(uVar29 + 0x90 + lVar22);
          auVar50._16_16_ = auVar47;
          auVar50._0_16_ = auVar47;
          auVar47 = *(undefined1 (*) [16])(uVar29 + 0xa0 + lVar22);
          auVar71._16_16_ = auVar47;
          auVar71._0_16_ = auVar47;
          auVar47 = *(undefined1 (*) [16])(uVar29 + 0xb0 + lVar22);
          auVar74._16_16_ = auVar47;
          auVar74._0_16_ = auVar47;
          auVar48 = vsubps_avx(auVar49,auVar37);
          auVar57 = vsubps_avx(auVar53,auVar43);
          auVar52 = vsubps_avx(auVar56,auVar46);
          auVar37 = vsubps_avx(auVar50,auVar49);
          auVar60 = vsubps_avx(auVar71,auVar53);
          auVar66 = vsubps_avx(auVar74,auVar56);
          auVar70._4_4_ = auVar57._4_4_ * auVar66._4_4_;
          auVar70._0_4_ = auVar57._0_4_ * auVar66._0_4_;
          auVar70._8_4_ = auVar57._8_4_ * auVar66._8_4_;
          auVar70._12_4_ = auVar57._12_4_ * auVar66._12_4_;
          auVar70._16_4_ = auVar57._16_4_ * auVar66._16_4_;
          auVar70._20_4_ = auVar57._20_4_ * auVar66._20_4_;
          auVar70._24_4_ = auVar57._24_4_ * auVar66._24_4_;
          auVar70._28_4_ = auVar41._12_4_;
          auVar42 = vfmsub231ps_fma(auVar70,auVar60,auVar52);
          uVar80 = *(undefined4 *)(ray + k * 4);
          auVar77._4_4_ = uVar80;
          auVar77._0_4_ = uVar80;
          auVar77._8_4_ = uVar80;
          auVar77._12_4_ = uVar80;
          auVar77._16_4_ = uVar80;
          auVar77._20_4_ = uVar80;
          auVar77._24_4_ = uVar80;
          auVar77._28_4_ = uVar80;
          uVar80 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar81._4_4_ = uVar80;
          auVar81._0_4_ = uVar80;
          auVar81._8_4_ = uVar80;
          auVar81._12_4_ = uVar80;
          auVar81._16_4_ = uVar80;
          auVar81._20_4_ = uVar80;
          auVar81._24_4_ = uVar80;
          auVar81._28_4_ = uVar80;
          uVar80 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar83._4_4_ = uVar80;
          auVar83._0_4_ = uVar80;
          auVar83._8_4_ = uVar80;
          auVar83._12_4_ = uVar80;
          auVar83._16_4_ = uVar80;
          auVar83._20_4_ = uVar80;
          auVar83._24_4_ = uVar80;
          auVar83._28_4_ = uVar80;
          fVar1 = *(float *)(ray + k * 4 + 0x40);
          auVar72._4_4_ = fVar1;
          auVar72._0_4_ = fVar1;
          auVar72._8_4_ = fVar1;
          auVar72._12_4_ = fVar1;
          auVar72._16_4_ = fVar1;
          auVar72._20_4_ = fVar1;
          auVar72._24_4_ = fVar1;
          auVar72._28_4_ = fVar1;
          auVar11._4_4_ = auVar52._4_4_ * auVar37._4_4_;
          auVar11._0_4_ = auVar52._0_4_ * auVar37._0_4_;
          auVar11._8_4_ = auVar52._8_4_ * auVar37._8_4_;
          auVar11._12_4_ = auVar52._12_4_ * auVar37._12_4_;
          auVar11._16_4_ = auVar52._16_4_ * auVar37._16_4_;
          auVar11._20_4_ = auVar52._20_4_ * auVar37._20_4_;
          auVar11._24_4_ = auVar52._24_4_ * auVar37._24_4_;
          auVar11._28_4_ = auVar45._12_4_;
          auVar70 = vsubps_avx(auVar49,auVar77);
          fVar2 = *(float *)(ray + k * 4 + 0x50);
          auVar78._4_4_ = fVar2;
          auVar78._0_4_ = fVar2;
          auVar78._8_4_ = fVar2;
          auVar78._12_4_ = fVar2;
          auVar78._16_4_ = fVar2;
          auVar78._20_4_ = fVar2;
          auVar78._24_4_ = fVar2;
          auVar78._28_4_ = fVar2;
          auVar51 = vfmsub231ps_fma(auVar11,auVar66,auVar48);
          auVar11 = vsubps_avx(auVar53,auVar81);
          fVar59 = *(float *)(ray + k * 4 + 0x60);
          auVar82._4_4_ = fVar59;
          auVar82._0_4_ = fVar59;
          auVar82._8_4_ = fVar59;
          auVar82._12_4_ = fVar59;
          auVar82._16_4_ = fVar59;
          auVar82._20_4_ = fVar59;
          auVar82._24_4_ = fVar59;
          auVar82._28_4_ = fVar59;
          auVar43 = vsubps_avx(auVar56,auVar83);
          auVar13._4_4_ = fVar1 * auVar11._4_4_;
          auVar13._0_4_ = fVar1 * auVar11._0_4_;
          auVar13._8_4_ = fVar1 * auVar11._8_4_;
          auVar13._12_4_ = fVar1 * auVar11._12_4_;
          auVar13._16_4_ = fVar1 * auVar11._16_4_;
          auVar13._20_4_ = fVar1 * auVar11._20_4_;
          auVar13._24_4_ = fVar1 * auVar11._24_4_;
          auVar13._28_4_ = uVar80;
          auVar41 = vfmsub231ps_fma(auVar13,auVar70,auVar78);
          auVar14._4_4_ = auVar66._4_4_ * auVar41._4_4_;
          auVar14._0_4_ = auVar66._0_4_ * auVar41._0_4_;
          auVar14._8_4_ = auVar66._8_4_ * auVar41._8_4_;
          auVar14._12_4_ = auVar66._12_4_ * auVar41._12_4_;
          auVar14._16_4_ = auVar66._16_4_ * 0.0;
          auVar14._20_4_ = auVar66._20_4_ * 0.0;
          auVar14._24_4_ = auVar66._24_4_ * 0.0;
          auVar14._28_4_ = auVar66._28_4_;
          auVar84._0_4_ = auVar52._0_4_ * auVar41._0_4_;
          auVar84._4_4_ = auVar52._4_4_ * auVar41._4_4_;
          auVar84._8_4_ = auVar52._8_4_ * auVar41._8_4_;
          auVar84._12_4_ = auVar52._12_4_ * auVar41._12_4_;
          auVar84._16_4_ = auVar52._16_4_ * 0.0;
          auVar84._20_4_ = auVar52._20_4_ * 0.0;
          auVar84._24_4_ = auVar52._24_4_ * 0.0;
          auVar84._28_4_ = 0;
          auVar66._4_4_ = fVar59 * auVar70._4_4_;
          auVar66._0_4_ = fVar59 * auVar70._0_4_;
          auVar66._8_4_ = fVar59 * auVar70._8_4_;
          auVar66._12_4_ = fVar59 * auVar70._12_4_;
          auVar66._16_4_ = fVar59 * auVar70._16_4_;
          auVar66._20_4_ = fVar59 * auVar70._20_4_;
          auVar66._24_4_ = fVar59 * auVar70._24_4_;
          auVar66._28_4_ = auVar52._28_4_;
          auVar45 = vfmsub231ps_fma(auVar66,auVar43,auVar72);
          auVar41 = vfmadd231ps_fma(auVar14,ZEXT1632(auVar45),auVar60);
          auVar45 = vfmadd231ps_fma(auVar84,auVar57,ZEXT1632(auVar45));
          auVar52._4_4_ = auVar48._4_4_ * auVar60._4_4_;
          auVar52._0_4_ = auVar48._0_4_ * auVar60._0_4_;
          auVar52._8_4_ = auVar48._8_4_ * auVar60._8_4_;
          auVar52._12_4_ = auVar48._12_4_ * auVar60._12_4_;
          auVar52._16_4_ = auVar48._16_4_ * auVar60._16_4_;
          auVar52._20_4_ = auVar48._20_4_ * auVar60._20_4_;
          auVar52._24_4_ = auVar48._24_4_ * auVar60._24_4_;
          auVar52._28_4_ = auVar60._28_4_;
          auVar36 = vfmsub231ps_fma(auVar52,auVar37,auVar57);
          auVar60._4_4_ = fVar2 * auVar43._4_4_;
          auVar60._0_4_ = fVar2 * auVar43._0_4_;
          auVar60._8_4_ = fVar2 * auVar43._8_4_;
          auVar60._12_4_ = fVar2 * auVar43._12_4_;
          auVar60._16_4_ = fVar2 * auVar43._16_4_;
          auVar60._20_4_ = fVar2 * auVar43._20_4_;
          auVar60._24_4_ = fVar2 * auVar43._24_4_;
          auVar60._28_4_ = auVar57._28_4_;
          auVar12 = vfmsub231ps_fma(auVar60,auVar11,auVar82);
          fVar1 = auVar36._0_4_;
          fVar2 = auVar36._4_4_;
          auVar15._4_4_ = fVar59 * fVar2;
          auVar15._0_4_ = fVar59 * fVar1;
          fVar6 = auVar36._8_4_;
          auVar15._8_4_ = fVar59 * fVar6;
          fVar7 = auVar36._12_4_;
          auVar15._12_4_ = fVar59 * fVar7;
          auVar15._16_4_ = fVar59 * 0.0;
          auVar15._20_4_ = fVar59 * 0.0;
          auVar15._24_4_ = fVar59 * 0.0;
          auVar15._28_4_ = fVar59;
          auVar47 = vfmadd231ps_fma(auVar15,ZEXT1632(auVar51),auVar78);
          auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),ZEXT1632(auVar42),auVar72);
          auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),ZEXT1632(auVar12),auVar37);
          auVar57 = vandps_avx(ZEXT1632(auVar47),local_23e0);
          uVar26 = auVar57._0_4_;
          local_2700._0_4_ = (float)(uVar26 ^ auVar41._0_4_);
          uVar20 = auVar57._4_4_;
          local_2700._4_4_ = (float)(uVar20 ^ auVar41._4_4_);
          uVar68 = auVar57._8_4_;
          local_2700._8_4_ = (float)(uVar68 ^ auVar41._8_4_);
          uVar69 = auVar57._12_4_;
          local_2700._12_4_ = (float)(uVar69 ^ auVar41._12_4_);
          local_26c0._16_4_ = auVar57._16_4_;
          local_2700._16_4_ = local_26c0._16_4_;
          local_26c0._20_4_ = auVar57._20_4_;
          local_2700._20_4_ = local_26c0._20_4_;
          local_26c0._24_4_ = auVar57._24_4_;
          local_2700._24_4_ = local_26c0._24_4_;
          local_26c0._28_4_ = auVar57._28_4_;
          local_2700._28_4_ = local_26c0._28_4_;
          auVar41 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar48,ZEXT1632(auVar12));
          local_26e0._0_4_ = (float)(uVar26 ^ auVar41._0_4_);
          local_26e0._4_4_ = (float)(uVar20 ^ auVar41._4_4_);
          local_26e0._8_4_ = (float)(uVar68 ^ auVar41._8_4_);
          local_26e0._12_4_ = (float)(uVar69 ^ auVar41._12_4_);
          local_26e0._16_4_ = local_26c0._16_4_;
          local_26e0._20_4_ = local_26c0._20_4_;
          local_26e0._24_4_ = local_26c0._24_4_;
          local_26e0._28_4_ = local_26c0._28_4_;
          auVar57 = vcmpps_avx(local_2700,ZEXT832(0) << 0x20,5);
          auVar48 = vcmpps_avx(local_26e0,ZEXT832(0) << 0x20,5);
          auVar57 = vandps_avx(auVar57,auVar48);
          auVar61._8_4_ = 0x7fffffff;
          auVar61._0_8_ = 0x7fffffff7fffffff;
          auVar61._12_4_ = 0x7fffffff;
          auVar61._16_4_ = 0x7fffffff;
          auVar61._20_4_ = 0x7fffffff;
          auVar61._24_4_ = 0x7fffffff;
          auVar61._28_4_ = 0x7fffffff;
          local_26a0 = vandps_avx(ZEXT1632(auVar47),auVar61);
          auVar48 = vcmpps_avx(ZEXT1632(auVar47),ZEXT832(0) << 0x20,4);
          auVar57 = vandps_avx(auVar57,auVar48);
          auVar75._0_4_ = local_2700._0_4_ + local_26e0._0_4_;
          auVar75._4_4_ = local_2700._4_4_ + local_26e0._4_4_;
          auVar75._8_4_ = local_2700._8_4_ + local_26e0._8_4_;
          auVar75._12_4_ = local_2700._12_4_ + local_26e0._12_4_;
          auVar75._16_4_ = local_26c0._16_4_ + local_26c0._16_4_;
          auVar75._20_4_ = local_26c0._20_4_ + local_26c0._20_4_;
          auVar75._24_4_ = local_26c0._24_4_ + local_26c0._24_4_;
          auVar75._28_4_ = local_26c0._28_4_ + local_26c0._28_4_;
          auVar48 = vcmpps_avx(auVar75,local_26a0,2);
          auVar52 = auVar48 & auVar57;
          if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar52 >> 0x7f,0) != '\0') ||
                (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar52 >> 0xbf,0) != '\0') ||
              (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar52[0x1f] < '\0') {
            auVar57 = vandps_avx(auVar57,auVar48);
            auVar41 = vpackssdw_avx(auVar57._0_16_,auVar57._16_16_);
            auVar16._4_4_ = fVar2 * auVar43._4_4_;
            auVar16._0_4_ = fVar1 * auVar43._0_4_;
            auVar16._8_4_ = fVar6 * auVar43._8_4_;
            auVar16._12_4_ = fVar7 * auVar43._12_4_;
            auVar16._16_4_ = auVar43._16_4_ * 0.0;
            auVar16._20_4_ = auVar43._20_4_ * 0.0;
            auVar16._24_4_ = auVar43._24_4_ * 0.0;
            auVar16._28_4_ = auVar43._28_4_;
            auVar45 = vfmadd213ps_fma(auVar11,ZEXT1632(auVar51),auVar16);
            auVar45 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar42),ZEXT1632(auVar45));
            local_26c0._0_4_ = (float)(uVar26 ^ auVar45._0_4_);
            local_26c0._4_4_ = (float)(uVar20 ^ auVar45._4_4_);
            local_26c0._8_4_ = (float)(uVar68 ^ auVar45._8_4_);
            local_26c0._12_4_ = (float)(uVar69 ^ auVar45._12_4_);
            fVar59 = *(float *)(ray + k * 4 + 0x30);
            auVar17._4_4_ = local_26a0._4_4_ * fVar59;
            auVar17._0_4_ = local_26a0._0_4_ * fVar59;
            auVar17._8_4_ = local_26a0._8_4_ * fVar59;
            auVar17._12_4_ = local_26a0._12_4_ * fVar59;
            auVar17._16_4_ = local_26a0._16_4_ * fVar59;
            auVar17._20_4_ = local_26a0._20_4_ * fVar59;
            auVar17._24_4_ = local_26a0._24_4_ * fVar59;
            auVar17._28_4_ = fVar59;
            auVar57 = vcmpps_avx(auVar17,local_26c0,1);
            fVar59 = *(float *)(ray + k * 4 + 0x80);
            auVar55 = ZEXT3264(CONCAT428(fVar59,CONCAT424(fVar59,CONCAT420(fVar59,CONCAT416(fVar59,
                                                  CONCAT412(fVar59,CONCAT48(fVar59,CONCAT44(fVar59,
                                                  fVar59))))))));
            auVar54._0_4_ = local_26a0._0_4_ * fVar59;
            auVar54._4_4_ = local_26a0._4_4_ * fVar59;
            auVar54._8_4_ = local_26a0._8_4_ * fVar59;
            auVar54._12_4_ = local_26a0._12_4_ * fVar59;
            auVar54._16_4_ = local_26a0._16_4_ * fVar59;
            auVar54._20_4_ = local_26a0._20_4_ * fVar59;
            auVar54._24_4_ = local_26a0._24_4_ * fVar59;
            auVar54._28_4_ = 0;
            auVar48 = vcmpps_avx(local_26c0,auVar54,2);
            auVar57 = vandps_avx(auVar57,auVar48);
            auVar45 = vpackssdw_avx(auVar57._0_16_,auVar57._16_16_);
            auVar41 = vpand_avx(auVar41,auVar45);
            auVar57 = vpmovzxwd_avx2(auVar41);
            auVar57 = vpslld_avx2(auVar57,0x1f);
            if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar57 >> 0x7f,0) != '\0') ||
                  (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar57 >> 0xbf,0) != '\0') ||
                (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar57[0x1f] < '\0') {
              local_2800 = vpsrad_avx2(auVar57,0x1f);
              local_2680 = ZEXT1632(auVar42);
              local_2660 = ZEXT1632(auVar51);
              local_2640 = ZEXT1632(auVar36);
              local_2620 = local_2800;
              local_2540 = local_24c0;
              local_2848 = context->scene;
              auVar48 = vrcpps_avx(local_26a0);
              auVar79._8_4_ = 0x3f800000;
              auVar79._0_8_ = 0x3f8000003f800000;
              auVar79._12_4_ = 0x3f800000;
              auVar79._16_4_ = 0x3f800000;
              auVar79._20_4_ = 0x3f800000;
              auVar79._24_4_ = 0x3f800000;
              auVar79._28_4_ = 0x3f800000;
              auVar45 = vfnmadd213ps_fma(local_26a0,auVar48,auVar79);
              auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar48,auVar48);
              fVar59 = auVar45._0_4_;
              fVar63 = auVar45._4_4_;
              local_25c0._4_4_ = fVar63 * local_26c0._4_4_;
              local_25c0._0_4_ = fVar59 * local_26c0._0_4_;
              fVar64 = auVar45._8_4_;
              local_25c0._8_4_ = fVar64 * local_26c0._8_4_;
              fVar65 = auVar45._12_4_;
              local_25c0._12_4_ = fVar65 * local_26c0._12_4_;
              local_25c0._16_4_ = local_26c0._16_4_ * 0.0;
              local_25c0._20_4_ = local_26c0._20_4_ * 0.0;
              local_25c0._24_4_ = local_26c0._24_4_ * 0.0;
              local_25c0._28_4_ = auVar48._28_4_;
              auVar58 = ZEXT3264(local_25c0);
              auVar18._4_4_ = fVar63 * local_2700._4_4_;
              auVar18._0_4_ = fVar59 * local_2700._0_4_;
              auVar18._8_4_ = fVar64 * local_2700._8_4_;
              auVar18._12_4_ = fVar65 * local_2700._12_4_;
              auVar18._16_4_ = local_26c0._16_4_ * 0.0;
              auVar18._20_4_ = local_26c0._20_4_ * 0.0;
              auVar18._24_4_ = local_26c0._24_4_ * 0.0;
              auVar18._28_4_ = local_26c0._28_4_;
              auVar48 = vminps_avx(auVar18,auVar79);
              auVar19._4_4_ = fVar63 * local_26e0._4_4_;
              auVar19._0_4_ = fVar59 * local_26e0._0_4_;
              auVar19._8_4_ = fVar64 * local_26e0._8_4_;
              auVar19._12_4_ = fVar65 * local_26e0._12_4_;
              auVar19._16_4_ = local_26c0._16_4_ * 0.0;
              auVar19._20_4_ = local_26c0._20_4_ * 0.0;
              auVar19._24_4_ = local_26c0._24_4_ * 0.0;
              auVar19._28_4_ = local_26c0._28_4_;
              auVar52 = vminps_avx(auVar19,auVar79);
              auVar37 = vsubps_avx(auVar79,auVar48);
              auVar60 = vsubps_avx(auVar79,auVar52);
              local_25e0 = vblendvps_avx(auVar52,auVar37,local_24c0);
              local_2600 = vblendvps_avx(auVar48,auVar60,local_24c0);
              fVar59 = local_24e0._0_4_;
              local_25a0._0_4_ = auVar42._0_4_ * fVar59;
              fVar63 = local_24e0._4_4_;
              local_25a0._4_4_ = auVar42._4_4_ * fVar63;
              fVar64 = local_24e0._8_4_;
              local_25a0._8_4_ = auVar42._8_4_ * fVar64;
              fVar65 = local_24e0._12_4_;
              local_25a0._12_4_ = auVar42._12_4_ * fVar65;
              fVar8 = local_24e0._16_4_;
              local_25a0._16_4_ = fVar8 * 0.0;
              fVar9 = local_24e0._20_4_;
              local_25a0._20_4_ = fVar9 * 0.0;
              fVar10 = local_24e0._24_4_;
              local_25a0._24_4_ = fVar10 * 0.0;
              local_25a0._28_4_ = 0;
              local_2580._0_4_ = fVar59 * auVar51._0_4_;
              local_2580._4_4_ = fVar63 * auVar51._4_4_;
              local_2580._8_4_ = fVar64 * auVar51._8_4_;
              local_2580._12_4_ = fVar65 * auVar51._12_4_;
              local_2580._16_4_ = fVar8 * 0.0;
              local_2580._20_4_ = fVar9 * 0.0;
              local_2580._24_4_ = fVar10 * 0.0;
              local_2580._28_4_ = 0;
              local_2560._0_4_ = fVar59 * fVar1;
              local_2560._4_4_ = fVar63 * fVar2;
              local_2560._8_4_ = fVar64 * fVar6;
              local_2560._12_4_ = fVar65 * fVar7;
              local_2560._16_4_ = fVar8 * 0.0;
              local_2560._20_4_ = fVar9 * 0.0;
              local_2560._24_4_ = fVar10 * 0.0;
              local_2560._28_4_ = 0;
              auVar38._8_4_ = 0x7f800000;
              auVar38._0_8_ = 0x7f8000007f800000;
              auVar38._12_4_ = 0x7f800000;
              auVar38._16_4_ = 0x7f800000;
              auVar38._20_4_ = 0x7f800000;
              auVar38._24_4_ = 0x7f800000;
              auVar38._28_4_ = 0x7f800000;
              auVar57 = vblendvps_avx(auVar38,local_25c0,auVar57);
              auVar48 = vshufps_avx(auVar57,auVar57,0xb1);
              auVar48 = vminps_avx(auVar57,auVar48);
              auVar52 = vshufpd_avx(auVar48,auVar48,5);
              auVar48 = vminps_avx(auVar48,auVar52);
              auVar52 = vpermpd_avx2(auVar48,0x4e);
              auVar48 = vminps_avx(auVar48,auVar52);
              auVar57 = vcmpps_avx(auVar57,auVar48,0);
              auVar45 = vpackssdw_avx(auVar57._0_16_,auVar57._16_16_);
              auVar41 = vpand_avx(auVar45,auVar41);
              auVar57 = vpmovzxwd_avx2(auVar41);
              auVar57 = vpslld_avx2(auVar57,0x1f);
              if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar57 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar57 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar57 >> 0x7f,0) == '\0') &&
                    (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar57 >> 0xbf,0) == '\0') &&
                  (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar57[0x1f]) {
                auVar57 = local_2800;
              }
              uVar20 = vmovmskps_avx(auVar57);
              uVar26 = 0;
              for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
                uVar26 = uVar26 + 1;
              }
              do {
                uVar32 = (ulong)uVar26;
                uVar26 = *(uint *)((long)&local_23c0 + uVar32 * 4);
                pGVar4 = (local_2848->geometries).items[uVar26].ptr;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_2800 + uVar32 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar80 = *(undefined4 *)(local_2600 + uVar32 * 4);
                    uVar3 = *(undefined4 *)(local_25e0 + uVar32 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + uVar32 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_25a0 + uVar32 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2580 + uVar32 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2560 + uVar32 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar80;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_27c0 + uVar32 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar26;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_2520 = auVar58._0_32_;
                  local_27e0 = auVar55._0_32_;
                  local_2500 = auVar85._0_32_;
                  uVar80 = *(undefined4 *)(local_2600 + uVar32 * 4);
                  local_2760._4_4_ = uVar80;
                  local_2760._0_4_ = uVar80;
                  local_2760._8_4_ = uVar80;
                  local_2760._12_4_ = uVar80;
                  local_2750 = *(undefined4 *)(local_25e0 + uVar32 * 4);
                  local_2730._4_4_ = uVar26;
                  local_2730._0_4_ = uVar26;
                  local_2730._8_4_ = uVar26;
                  local_2730._12_4_ = uVar26;
                  uVar80 = *(undefined4 *)((long)&local_27c0 + uVar32 * 4);
                  local_2740._4_4_ = uVar80;
                  local_2740._0_4_ = uVar80;
                  local_2740._8_4_ = uVar80;
                  local_2740._12_4_ = uVar80;
                  uVar80 = *(undefined4 *)(local_25a0 + uVar32 * 4);
                  uVar3 = *(undefined4 *)(local_2580 + uVar32 * 4);
                  local_2780._4_4_ = uVar3;
                  local_2780._0_4_ = uVar3;
                  local_2780._8_4_ = uVar3;
                  local_2780._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_2560 + uVar32 * 4);
                  local_2770._4_4_ = uVar3;
                  local_2770._0_4_ = uVar3;
                  local_2770._8_4_ = uVar3;
                  local_2770._12_4_ = uVar3;
                  local_2790[0] = (RTCHitN)(char)uVar80;
                  local_2790[1] = (RTCHitN)(char)((uint)uVar80 >> 8);
                  local_2790[2] = (RTCHitN)(char)((uint)uVar80 >> 0x10);
                  local_2790[3] = (RTCHitN)(char)((uint)uVar80 >> 0x18);
                  local_2790[4] = (RTCHitN)(char)uVar80;
                  local_2790[5] = (RTCHitN)(char)((uint)uVar80 >> 8);
                  local_2790[6] = (RTCHitN)(char)((uint)uVar80 >> 0x10);
                  local_2790[7] = (RTCHitN)(char)((uint)uVar80 >> 0x18);
                  local_2790[8] = (RTCHitN)(char)uVar80;
                  local_2790[9] = (RTCHitN)(char)((uint)uVar80 >> 8);
                  local_2790[10] = (RTCHitN)(char)((uint)uVar80 >> 0x10);
                  local_2790[0xb] = (RTCHitN)(char)((uint)uVar80 >> 0x18);
                  local_2790[0xc] = (RTCHitN)(char)uVar80;
                  local_2790[0xd] = (RTCHitN)(char)((uint)uVar80 >> 8);
                  local_2790[0xe] = (RTCHitN)(char)((uint)uVar80 >> 0x10);
                  local_2790[0xf] = (RTCHitN)(char)((uint)uVar80 >> 0x18);
                  uStack_274c = local_2750;
                  uStack_2748 = local_2750;
                  uStack_2744 = local_2750;
                  vpcmpeqd_avx2(ZEXT1632(local_2760),ZEXT1632(local_2760));
                  uStack_271c = context->user->instID[0];
                  local_2720 = uStack_271c;
                  uStack_2718 = uStack_271c;
                  uStack_2714 = uStack_271c;
                  uStack_2710 = context->user->instPrimID[0];
                  uStack_270c = uStack_2710;
                  uStack_2708 = uStack_2710;
                  uStack_2704 = uStack_2710;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + uVar32 * 4);
                  local_2870 = *local_2840;
                  local_2830.valid = (int *)local_2870;
                  local_2830.geometryUserPtr = pGVar4->userPtr;
                  local_2830.context = context->user;
                  local_2830.hit = local_2790;
                  local_2830.N = 4;
                  local_2830.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar4->intersectionFilterN)(&local_2830);
                  }
                  if (local_2870 == (undefined1  [16])0x0) {
                    auVar41 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar41 = auVar41 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var5)(&local_2830);
                    }
                    auVar45 = vpcmpeqd_avx(local_2870,_DAT_01f7aa10);
                    auVar41 = auVar45 ^ _DAT_01f7ae20;
                    if (local_2870 != (undefined1  [16])0x0) {
                      auVar45 = auVar45 ^ _DAT_01f7ae20;
                      auVar47 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])local_2830.hit);
                      *(undefined1 (*) [16])(local_2830.ray + 0xc0) = auVar47;
                      auVar47 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(local_2830.hit + 0x10)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0xd0) = auVar47;
                      auVar47 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(local_2830.hit + 0x20)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0xe0) = auVar47;
                      auVar47 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(local_2830.hit + 0x30)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0xf0) = auVar47;
                      auVar47 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(local_2830.hit + 0x40)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0x100) = auVar47;
                      auVar47 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(local_2830.hit + 0x50)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0x110) = auVar47;
                      auVar47 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(local_2830.hit + 0x60)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0x120) = auVar47;
                      auVar47 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(local_2830.hit + 0x70)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0x130) = auVar47;
                      auVar45 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(local_2830.hit + 0x80)
                                              );
                      *(undefined1 (*) [16])(local_2830.ray + 0x140) = auVar45;
                    }
                  }
                  auVar36._8_8_ = 0x100000001;
                  auVar36._0_8_ = 0x100000001;
                  if ((auVar36 & auVar41) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_27e0._0_4_;
                  }
                  else {
                    local_27e0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                  }
                  *(undefined4 *)(local_2800 + uVar32 * 4) = 0;
                  auVar55 = ZEXT3264(local_27e0);
                  uVar80 = local_27e0._0_4_;
                  auVar39._4_4_ = uVar80;
                  auVar39._0_4_ = uVar80;
                  auVar39._8_4_ = uVar80;
                  auVar39._12_4_ = uVar80;
                  auVar39._16_4_ = uVar80;
                  auVar39._20_4_ = uVar80;
                  auVar39._24_4_ = uVar80;
                  auVar39._28_4_ = uVar80;
                  auVar58 = ZEXT3264(local_2520);
                  auVar57 = vcmpps_avx(local_2520,auVar39,2);
                  local_2800 = vandps_avx(auVar57,local_2800);
                  auVar85 = ZEXT3264(local_2500);
                }
                if ((((((((local_2800 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_2800 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_2800 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_2800 >> 0x7f,0) == '\0') &&
                      (local_2800 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_2800 >> 0xbf,0) == '\0') &&
                    (local_2800 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_2800[0x1f]) break;
                auVar44._8_4_ = 0x7f800000;
                auVar44._0_8_ = 0x7f8000007f800000;
                auVar44._12_4_ = 0x7f800000;
                auVar44._16_4_ = 0x7f800000;
                auVar44._20_4_ = 0x7f800000;
                auVar44._24_4_ = 0x7f800000;
                auVar44._28_4_ = 0x7f800000;
                auVar57 = vblendvps_avx(auVar44,auVar58._0_32_,local_2800);
                auVar48 = vshufps_avx(auVar57,auVar57,0xb1);
                auVar48 = vminps_avx(auVar57,auVar48);
                auVar52 = vshufpd_avx(auVar48,auVar48,5);
                auVar48 = vminps_avx(auVar48,auVar52);
                auVar52 = vpermpd_avx2(auVar48,0x4e);
                auVar48 = vminps_avx(auVar48,auVar52);
                auVar48 = vcmpps_avx(auVar57,auVar48,0);
                auVar52 = local_2800 & auVar48;
                auVar57 = local_2800;
                if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar52 >> 0x7f,0) != '\0') ||
                      (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar52 >> 0xbf,0) != '\0') ||
                    (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar52[0x1f] < '\0') {
                  auVar57 = vandps_avx(auVar48,local_2800);
                }
                uVar20 = vmovmskps_avx(auVar57);
                uVar26 = 0;
                for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
                  uVar26 = uVar26 + 1;
                }
              } while( true );
            }
          }
          local_2860 = local_2860 + 1;
        } while (local_2860 != local_2858);
      }
      uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar40 = ZEXT3264(CONCAT428(uVar80,CONCAT424(uVar80,CONCAT420(uVar80,CONCAT416(uVar80,
                                                  CONCAT412(uVar80,CONCAT48(uVar80,CONCAT44(uVar80,
                                                  uVar80))))))));
      auVar55 = ZEXT3264(local_2400);
      auVar58 = ZEXT3264(local_2420);
      auVar62 = ZEXT3264(local_2440);
      auVar67 = ZEXT3264(local_2460);
      auVar73 = ZEXT3264(local_2480);
      auVar76 = ZEXT3264(local_24a0);
    }
    if (pauVar21 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }